

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O2

int __thiscall
sjtu::DynamicFileManager<sjtu::trainType>::init
          (DynamicFileManager<sjtu::trainType> *this,EVP_PKEY_CTX *ctx)

{
  fstream *file_;
  byte bVar1;
  int iVar2;
  LRUCache<sjtu::trainType> *pLVar3;
  byte in_CL;
  uint in_EDX;
  locType loc;
  ofstream outfile;
  ifstream infile;
  trainType tmp;
  
  pLVar3 = (this->super_FileManager_Base<sjtu::trainType>).cache;
  if (pLVar3 != (LRUCache<sjtu::trainType> *)0x0) {
    LRUCache<sjtu::trainType>::~LRUCache(pLVar3);
    operator_delete(pLVar3,0x48);
  }
  pLVar3 = (LRUCache<sjtu::trainType> *)operator_new(0x48);
  file_ = &(this->super_FileManager_Base<sjtu::trainType>).file;
  LRUCache<sjtu::trainType>::LRUCache(pLVar3,(ulong)in_EDX,file_);
  (this->super_FileManager_Base<sjtu::trainType>).cache = pLVar3;
  std::ifstream::ifstream(&infile,(string *)ctx,_S_in);
  bVar1 = std::__basic_file<char>::is_open();
  if ((byte)(bVar1 ^ 1 | in_CL) == 1) {
    (this->super_FileManager_Base<sjtu::trainType>).is_newfile = true;
    std::ofstream::ofstream(&outfile,(string *)ctx,_S_out|_S_bin);
    tmp.startTime.month = 0;
    tmp.startTime.day = 0;
    tmp.startTime.hour = 0;
    tmp.startTime.minute = 0;
    tmp.saleDate[1].month = 0;
    tmp.saleDate[1].day = 0;
    tmp.saleDate[1].hour = 0;
    tmp.saleDate[1].minute = 0;
    tmp.saleDate[0].month = 0;
    tmp.saleDate[0].day = 0;
    tmp.saleDate[0].hour = 0;
    tmp.saleDate[0].minute = 0;
    std::ostream::write((char *)&outfile,(long)&tmp);
    loc = 0xa7a8;
    std::ostream::seekp((long)&outfile,0xffff5858);
    std::ostream::write((char *)&outfile,(long)&loc);
    std::ofstream::close();
    std::ofstream::~ofstream(&outfile);
  }
  else {
    (this->super_FileManager_Base<sjtu::trainType>).is_newfile = false;
  }
  std::ifstream::close();
  std::fstream::open((string *)file_,(_Ios_Openmode)ctx);
  iVar2 = std::ifstream::~ifstream(&infile);
  return iVar2;
}

Assistant:

virtual void init(std::string filepath , unsigned int cache_size , bool is_reset = false) override
		{
			if (cache) delete cache;
			cache = new LRUCache<T>(cache_size , file);
			std::ifstream infile(filepath , std::ios_base::in);
			if (!infile.is_open() || is_reset)
			{
				is_newfile = true;
				std::ofstream outfile(filepath , std::ios_base::out | std::ios_base::binary);
				T tmp;
				outfile.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				locType loc = sizeof (T);
				outfile.seekp(- sizeof (T) , std::ios_base::cur) , outfile.write(reinterpret_cast<char *> (&loc) , sizeof (locType));
				outfile.close();
			}else is_newfile = false;
			infile.close();
			file.open(filepath , std::ios_base::in | std::ios_base::out | std::ios_base::binary);
		}